

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::clear(Value *this)

{
  long in_RDI;
  ostringstream oss;
  string *in_stack_fffffffffffffe50;
  ostringstream local_180 [384];
  
  if ((((*(ushort *)(in_RDI + 8) & 0xff) != 0) && ((*(ushort *)(in_RDI + 8) & 0xff) != 6)) &&
     ((*(ushort *)(in_RDI + 8) & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::operator<<((ostream *)local_180,"in Json::Value::clear(): requires complex value");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffe50);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
    abort();
  }
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  if (*(char *)(in_RDI + 8) == '\x06' || *(char *)(in_RDI + 8) == '\a') {
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::clear((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             *)0x15dcb4);
  }
  return;
}

Assistant:

void Value::clear() {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue ||
                          type_ == objectValue,
                      "in Json::Value::clear(): requires complex value");
  start_ = 0;
  limit_ = 0;
  switch (type_) {
  case arrayValue:
  case objectValue:
    value_.map_->clear();
    break;
  default:
    break;
  }
}